

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O3

void scan_flux_vista(TrackData *trackdata)

{
  FluxData *flux_revs;
  BitBuffer bitbuf;
  FluxDecoder decoder;
  BitBuffer local_c0;
  FluxDecoder local_58;
  
  flux_revs = TrackData::flux(trackdata);
  FluxDecoder::FluxDecoder(&local_58,flux_revs,2000,100,4);
  BitBuffer::BitBuffer(&local_c0,_250K,&local_58);
  TrackData::add(trackdata,&local_c0);
  scan_bitstream_vista(trackdata);
  if (local_c0.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void scan_flux_vista(TrackData& trackdata)
{
    // Fixed data rate.
    auto datarate = DataRate::_250K;
    FluxDecoder decoder(trackdata.flux(), bitcell_ns(datarate));
    BitBuffer bitbuf(datarate, decoder);

    trackdata.add(std::move(bitbuf));
    scan_bitstream_vista(trackdata);
}